

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swab.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_dd8::ByteSwap<sptk::uint24_t>::ByteSwap
          (ByteSwap<sptk::uint24_t> *this,int start_address,int start_offset,int end_address,
          int end_offset)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  ByteSwapInterface *in_RDI;
  undefined4 in_R8D;
  
  ByteSwapInterface::ByteSwapInterface(in_RDI);
  in_RDI->_vptr_ByteSwapInterface = (_func_int **)&PTR__ByteSwap_0012ab78;
  *(undefined4 *)&in_RDI[1]._vptr_ByteSwapInterface = in_ESI;
  *(undefined4 *)((long)&in_RDI[1]._vptr_ByteSwapInterface + 4) = in_EDX;
  *(undefined4 *)&in_RDI[2]._vptr_ByteSwapInterface = in_ECX;
  *(undefined4 *)((long)&in_RDI[2]._vptr_ByteSwapInterface + 4) = in_R8D;
  return;
}

Assistant:

ByteSwap(int start_address, int start_offset, int end_address, int end_offset)
      : start_address_(start_address),
        start_offset_(start_offset),
        end_address_(end_address),
        end_offset_(end_offset) {
  }